

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void jpeg_make_c_derived_tbl(j_compress_ptr cinfo,boolean isDC,int tblno,c_derived_tbl **pdtbl)

{
  byte bVar1;
  jpeg_error_mgr *pjVar2;
  JHUFF_TBL *pJVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  c_derived_tbl *local_568;
  char huffsize [257];
  uint huffcode [257];
  
  if (3 < (uint)tblno) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x32;
    (pjVar2->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar3 = cinfo->dc_huff_tbl_ptrs[(ulong)(isDC == 0) * 4 + (long)tblno];
  if (pJVar3 == (JHUFF_TBL *)0x0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x32;
    (pjVar2->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  local_568 = *pdtbl;
  if (local_568 == (c_derived_tbl *)0x0) {
    local_568 = (c_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x500);
    *pdtbl = local_568;
  }
  uVar11 = 0;
  lVar7 = 1;
  while( true ) {
    iVar10 = (int)uVar11;
    if (lVar7 == 0x11) break;
    bVar1 = pJVar3->bits[lVar7];
    if (0x100 < (int)(iVar10 + (uint)bVar1)) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 8;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    for (lVar5 = 0; (uint)bVar1 != (uint)lVar5; lVar5 = lVar5 + 1) {
      huffsize[lVar5 + iVar10] = (char)lVar7;
    }
    uVar11 = (ulong)(iVar10 + (uint)lVar5);
    lVar7 = lVar7 + 1;
  }
  huffsize[iVar10] = '\0';
  iVar9 = (int)huffsize[0];
  lVar7 = 0;
  uVar6 = 0;
  while (huffsize[0] != '\0') {
    lVar5 = lVar7 << 0x20;
    lVar7 = (long)(int)lVar7;
    uVar12 = uVar6 * 2;
    while (iVar9 == huffsize[0]) {
      huffcode[lVar7] = uVar6;
      lVar4 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x100000000;
      uVar12 = uVar12 + 2;
      huffsize[0] = huffsize[lVar4];
    }
    if (1L << ((byte)iVar9 & 0x3f) <= (long)(ulong)uVar6) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 8;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    iVar9 = iVar9 + 1;
    uVar6 = uVar12;
    huffsize[0] = huffsize[lVar5 >> 0x20];
  }
  uVar8 = 0;
  if (iVar10 < 1) {
    uVar11 = 0;
  }
  memset(local_568,0,0x500);
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    bVar1 = pJVar3->huffval[uVar8];
    if (((isDC != 0) && (0xf < bVar1)) || (local_568->ehufsi[bVar1] != '\0')) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 8;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    local_568->ehufco[bVar1] = huffcode[uVar8];
    local_568->ehufsi[bVar1] = huffsize[uVar8];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_make_c_derived_tbl(j_compress_ptr cinfo, boolean isDC, int tblno,
                        c_derived_tbl **pdtbl)
{
  JHUFF_TBL *htbl;
  c_derived_tbl *dtbl;
  int p, i, l, lastp, si, maxsymbol;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (c_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(c_derived_tbl));
  dtbl = *pdtbl;

  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int)htbl->bits[l];
    if (i < 0 || p + i > 256)   /* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char)l;
  }
  huffsize[p] = 0;
  lastp = p;

  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int)huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((JLONG)code) >= (((JLONG)1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure C.3: generate encoding tables */
  /* These are code and size indexed by symbol value */

  /* Set all codeless symbols to have code length 0;
   * this lets us detect duplicate VAL entries here, and later
   * allows emit_bits to detect any attempt to emit such symbols.
   */
  MEMZERO(dtbl->ehufco, sizeof(dtbl->ehufco));
  MEMZERO(dtbl->ehufsi, sizeof(dtbl->ehufsi));

  /* This is also a convenient place to check for out-of-range
   * and duplicated VAL entries.  We allow 0..255 for AC symbols
   * but only 0..15 for DC.  (We could constrain them further
   * based on data depth and mode, but this seems enough.)
   */
  maxsymbol = isDC ? 15 : 255;

  for (p = 0; p < lastp; p++) {
    i = htbl->huffval[p];
    if (i < 0 || i > maxsymbol || dtbl->ehufsi[i])
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    dtbl->ehufco[i] = huffcode[p];
    dtbl->ehufsi[i] = huffsize[p];
  }
}